

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O1

void __thiscall Snes_Spc::set_output(Snes_Spc *this,sample_t_conflict1 *out,int size)

{
  int *piVar1;
  sample_t_conflict1 sVar2;
  sample_t_conflict1 *psVar3;
  sample_t_conflict1 *psVar4;
  char *pcVar5;
  bool bVar6;
  
  piVar1 = &(this->m).extra_clocks;
  *piVar1 = *piVar1 & 0x1f;
  if (out == (sample_t_conflict1 *)0x0) {
    (this->m).extra_buf[0] = 0;
    (this->m).extra_buf[1] = 0;
    (this->m).extra_buf[2] = 0;
    (this->m).extra_buf[3] = 0;
    (this->m).extra_buf[4] = 0;
    (this->m).extra_buf[5] = 0;
    (this->m).extra_buf[6] = 0;
    (this->m).extra_buf[7] = 0;
    (this->m).extra_pos = (this->m).extra_buf + 8;
    (this->m).buf_begin = (sample_t_conflict1 *)0x0;
    Spc_Dsp::set_output(&this->dsp,(sample_t_conflict1 *)0x0,0);
    return;
  }
  pcVar5 = (char *)(out + size);
  (this->m).buf_begin = out;
  (this->m).buf_end = (sample_t_conflict1 *)pcVar5;
  psVar4 = (this->m).extra_buf;
  psVar3 = (this->m).extra_pos;
  bVar6 = 0 < size;
  if (0 < size && psVar4 < psVar3) {
    do {
      sVar2 = *psVar4;
      psVar4 = psVar4 + 1;
      *out = sVar2;
      out = out + 1;
      bVar6 = out < pcVar5;
      if (psVar3 <= psVar4) break;
    } while (out < pcVar5);
  }
  if (!bVar6) {
    out = (this->dsp).m.extra;
    pcVar5 = this->reg_times;
    for (; psVar4 < psVar3; psVar4 = psVar4 + 1) {
      *out = *psVar4;
      out = out + 1;
    }
  }
  Spc_Dsp::set_output(&this->dsp,out,(int)((ulong)((long)pcVar5 - (long)out) >> 1));
  return;
}

Assistant:

void Snes_Spc::set_output( sample_t* out, int size )
{
	require( (size & 1) == 0 ); // size must be even
	
	m.extra_clocks &= clocks_per_sample - 1;
	if ( out )
	{
		sample_t const* out_end = out + size;
		m.buf_begin = out;
		m.buf_end   = out_end;
		
		// Copy extra to output
		sample_t const* in = m.extra_buf;
		while ( in < m.extra_pos && out < out_end )
			*out++ = *in++;
		
		// Handle output being full already
		if ( out >= out_end )
		{
			// Have DSP write to remaining extra space
			out     = dsp.extra();
			out_end = &dsp.extra() [extra_size];
			
			// Copy any remaining extra samples as if DSP wrote them
			while ( in < m.extra_pos )
				*out++ = *in++;
			assert( out <= out_end );
		}
		
		dsp.set_output( out, int(out_end - out) );
	}
	else
	{
		reset_buf();
	}
}